

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.h
# Opt level: O1

void __thiscall
shift_window_transformer::SoftMax<float>::forward
          (SoftMax<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  uint uVar1;
  pointer pfVar2;
  iterator __position;
  long lVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  double dVar7;
  double local_58;
  float local_4c;
  long local_48;
  long local_40;
  ulong local_38;
  
  uVar1 = (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  lVar3 = (long)(int)uVar1;
  pfVar2 = (output->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((output->super_vector<float,_std::allocator<float>_>).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish !=
      pfVar2) {
    (output->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         pfVar2;
  }
  std::vector<int,_std::allocator<int>_>::operator=(&output->shape,&input->shape);
  if ((input->super_vector<float,_std::allocator<float>_>).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish !=
      (input->super_vector<float,_std::allocator<float>_>).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start) {
    local_40 = lVar3 * 4;
    lVar4 = 0;
    local_38 = 0;
    local_48 = lVar3;
    do {
      if ((int)uVar1 < 1) {
        local_58 = 0.0;
      }
      else {
        fVar6 = 0.0;
        lVar3 = lVar4;
        uVar5 = (ulong)uVar1;
        do {
          dVar7 = exp((double)*(float *)((long)(input->super_vector<float,_std::allocator<float>_>).
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start + lVar3));
          fVar6 = (float)((double)fVar6 + dVar7);
          lVar3 = lVar3 + 4;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        local_58 = (double)fVar6;
        lVar3 = local_48;
      }
      if (0 < (int)lVar3) {
        uVar5 = 0;
        do {
          dVar7 = exp((double)*(float *)((long)(input->super_vector<float,_std::allocator<float>_>).
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start +
                                        uVar5 * 4 + lVar4));
          local_4c = (float)(dVar7 / local_58);
          __position._M_current =
               (output->super_vector<float,_std::allocator<float>_>).
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (__position._M_current ==
              (output->super_vector<float,_std::allocator<float>_>).
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&output->super_vector<float,_std::allocator<float>_>,__position,&local_4c);
          }
          else {
            *__position._M_current = local_4c;
            (output->super_vector<float,_std::allocator<float>_>).
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      local_38 = local_38 + lVar3;
      lVar4 = lVar4 + local_40;
    } while (local_38 <
             (ulong)((long)(input->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(input->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void forward(const Tensor <T> &input, Tensor <T> &output) {
            int dim = input.shape.back();
            output.clear();
            output.shape = input.shape;
            for (int i = 0; i < input.size(); i += dim) {
                T sum = 0;
                for (int j = 0; j < dim; ++j) {
                    sum += exp(input[i + j]);
                }
                for (int j = 0; j < dim; ++j) {
                    output.push_back(exp(input[i + j]) / sum);
                }
            }
        }